

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::GetTileSize
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,Uint32 *TileSizeX,Uint32 *TileSizeY
          )

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  Uint32 *TileSizeY_local;
  Uint32 *TileSizeX_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = TileSizeY;
  FormatString<char[96]>
            ((string *)local_40,
             (char (*) [96])
             "Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature."
            );
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"GetTileSize",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
             ,0x131);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

GetTileSize(Uint32& TileSizeX, Uint32& TileSizeY) override
    {
        UNSUPPORTED("Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature.");
    }